

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-quant.cpp
# Opt level: O0

uint32_t llama_model_quantize(char *fname_inp,char *fname_out,llama_model_quantize_params *params)

{
  exception *err;
  llama_model_quantize_params *in_stack_000026d0;
  string *in_stack_000026d8;
  string *in_stack_000026e0;
  allocator<char> local_79;
  string local_78 [8];
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  llama_model_quantize_impl(in_stack_000026e0,in_stack_000026d8,in_stack_000026d0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return 0;
}

Assistant:

uint32_t llama_model_quantize(
        const char * fname_inp,
        const char * fname_out,
        const llama_model_quantize_params * params) {
    try {
        llama_model_quantize_impl(fname_inp, fname_out, params);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to quantize: %s\n", __func__, err.what());
        return 1;
    }

    return 0;
}